

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

bool __thiscall kws::Parser::IsInComments(Parser *this,size_t pos)

{
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (((pos == 0xffffffffffffffff) || ((this->m_CommentBegin)._M_string_length == 0)) ||
     ((this->m_CommentEnd)._M_string_length == 0)) {
    bVar2 = false;
  }
  else {
    psVar1 = &this->m_Buffer;
    bVar2 = false;
    uVar3 = std::__cxx11::string::find((string *)psVar1,(ulong)&this->m_CommentBegin);
    if (uVar3 != 0xffffffffffffffff) {
      while( true ) {
        uVar4 = std::__cxx11::string::find((string *)psVar1,(ulong)&this->m_CommentEnd);
        bVar2 = uVar3 < uVar4 && uVar4 != 0xffffffffffffffff;
        if ((uVar3 >= uVar4 || uVar4 == 0xffffffffffffffff) ||
           ((uVar3 <= pos && (pos <= uVar4 + (this->m_CommentEnd)._M_string_length)))) break;
        uVar3 = std::__cxx11::string::find((string *)psVar1,(ulong)&this->m_CommentBegin);
      }
    }
  }
  return bVar2;
}

Assistant:

bool Parser::IsInComments(size_t pos) const
{
  if ((pos == std::string::npos) || (m_CommentBegin.empty()) ||
      (m_CommentEnd.empty())) {
    return false;
  }

  size_t b0 = m_Buffer.find(m_CommentBegin,0);

  if(b0 == std::string::npos)
   {
   return false;
   }

  size_t b1 = m_Buffer.find(m_CommentEnd,b0);

  while(b0 != std::string::npos && b1 != std::string::npos && b1>b0)
    {
    if(pos>=b0 && pos<=(b1+m_CommentEnd.size()))
      {
      return true;
      }
    b0 = m_Buffer.find(m_CommentBegin,b0+1);
    b1 = m_Buffer.find(m_CommentEnd,b0);
    }

  return false;
}